

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgb2spec_opt.cpp
# Opt level: O1

void __thiscall ParallelForLoop1D::RunStep(ParallelForLoop1D *this,unique_lock<std::mutex> *lock)

{
  _func_int **pp_Var1;
  long lVar2;
  ParallelJob *pPVar3;
  ParallelJob *pPVar4;
  code *pcVar5;
  code *pcVar6;
  byte bVar7;
  int iVar8;
  undefined8 *extraout_RDX;
  long lVar9;
  unique_lock<std::mutex> *puVar10;
  unique_lock<std::mutex> *puVar11;
  long lVar12;
  pointer ptVar13;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined1 auStack_d0 [16];
  undefined1 auStack_c0 [16];
  undefined **appuStack_b0 [4];
  undefined8 uStack_90;
  undefined8 uStack_88;
  code *pcStack_80;
  undefined8 uStack_78;
  unique_lock<std::mutex> *puStack_70;
  unique_lock<std::mutex> *puStack_68;
  undefined4 uStack_60;
  ParallelForLoop1D *pPStack_58;
  pointer ptStack_50;
  unique_lock<std::mutex> *puStack_48;
  code *pcStack_40;
  pointer local_30;
  long local_28;
  
  pp_Var1 = (this->super_ParallelJob)._vptr_ParallelJob;
  lVar2 = this->nextIndex;
  ptVar13 = (pointer)(this->chunkSize + lVar2);
  if ((long)this->maxIndex < (long)ptVar13) {
    ptVar13 = (pointer)this->maxIndex;
  }
  this->nextIndex = (int64_t)ptVar13;
  pcStack_40 = (code *)0x1045f7;
  puVar10 = lock;
  iVar8 = (*pp_Var1[3])();
  if ((char)iVar8 == '\0') {
    pPVar3 = (this->super_ParallelJob).prev;
    if (pPVar3 == (ParallelJob *)0x0) {
      *(ParallelJob **)
       threadPool._M_t.super___uniq_ptr_impl<ThreadPool,_std::default_delete<ThreadPool>_>._M_t.
       super__Tuple_impl<0UL,_ThreadPool_*,_std::default_delete<ThreadPool>_>.
       super__Head_base<0UL,_ThreadPool_*,_false>._M_head_impl = (this->super_ParallelJob).next;
    }
    else {
      pPVar3->next = (this->super_ParallelJob).next;
    }
    pPVar4 = (this->super_ParallelJob).next;
    if (pPVar4 != (ParallelJob *)0x0) {
      pPVar4->prev = pPVar3;
    }
    (this->super_ParallelJob).removed = true;
  }
  pcStack_40 = (code *)0x104635;
  puVar11 = lock;
  std::unique_lock<std::mutex>::unlock(lock);
  local_30 = ptVar13;
  local_28 = lVar2;
  if ((this->func).super__Function_base._M_manager != (_Manager_type)0x0) {
    pcStack_40 = (code *)0x104657;
    (*(this->func)._M_invoker)((_Any_data *)&this->func,&local_28,(long *)&local_30);
    return;
  }
  pcStack_40 = ParallelFor;
  std::__throw_bad_function_call();
  if ((__uniq_ptr_impl<ThreadPool,_std::default_delete<ThreadPool>_>)
      threadPool._M_t.super___uniq_ptr_impl<ThreadPool,_std::default_delete<ThreadPool>_>._M_t.
      super__Tuple_impl<0UL,_ThreadPool_*,_std::default_delete<ThreadPool>_>.
      super__Head_base<0UL,_ThreadPool_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<ThreadPool,_std::default_delete<ThreadPool>_>)0x0) {
    lVar12 = 8;
  }
  else {
    lVar12 = (long)(((ulong)(*(int *)((long)threadPool._M_t.
                                            super___uniq_ptr_impl<ThreadPool,_std::default_delete<ThreadPool>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_ThreadPool_*,_std::default_delete<ThreadPool>_>
                                            .super__Head_base<0UL,_ThreadPool_*,_false>._M_head_impl
                                     + 0x68) -
                             *(int *)((long)threadPool._M_t.
                                            super___uniq_ptr_impl<ThreadPool,_std::default_delete<ThreadPool>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_ThreadPool_*,_std::default_delete<ThreadPool>_>
                                            .super__Head_base<0UL,_ThreadPool_*,_false>._M_head_impl
                                     + 0x60) & 0xfffffff8) << 0x20) + 0x800000000) >> 0x20;
  }
  lVar12 = ((long)puVar10 - (long)puVar11) / lVar12;
  lVar9 = 1;
  if (1 < lVar12) {
    lVar9 = lVar12;
  }
  uStack_e0._0_1_ = (condition_variable)0x0;
  uStack_e0._1_7_ = 0;
  uStack_d8 = 0;
  uStack_78 = extraout_RDX[3];
  auStack_d0._0_8_ = (code *)0x0;
  pcVar5 = (code *)extraout_RDX[2];
  pcVar6 = (code *)auStack_d0._0_8_;
  if (pcVar5 != (code *)0x0) {
    uStack_e0 = *extraout_RDX;
    uStack_d8 = extraout_RDX[1];
    extraout_RDX[2] = 0;
    extraout_RDX[3] = 0;
    pcVar6 = pcVar5;
  }
  auStack_d0._8_8_ = uStack_78;
  auStack_d0._0_8_ = pcVar6;
  appuStack_b0[1] = (undefined **)0x0;
  appuStack_b0[2]._0_5_ = 0;
  appuStack_b0[2]._5_3_ = 0;
  appuStack_b0[3]._0_4_ = 0;
  appuStack_b0[3]._4_1_ = '\0';
  appuStack_b0[0] = &PTR__ParallelForLoop1D_00109cc0;
  uStack_90._0_1_ = (condition_variable)0x0;
  uStack_90._1_7_ = 0;
  uStack_88 = 0;
  pcStack_80 = (code *)0x0;
  if (pcVar6 != (code *)0x0) {
    uStack_90._0_1_ = uStack_e0._0_1_;
    uStack_90._1_7_ = uStack_e0._1_7_;
    uStack_88 = uStack_d8;
    auStack_d0 = ZEXT816(0) << 0x20;
    pcStack_80 = pcVar6;
  }
  uStack_60 = (undefined4)lVar9;
  puStack_70 = puVar11;
  puStack_68 = puVar10;
  pPStack_58 = this;
  ptStack_50 = ptVar13;
  puStack_48 = lock;
  pcStack_40 = (code *)lVar2;
  if ((code *)auStack_d0._0_8_ != (code *)0x0) {
    (*(code *)auStack_d0._0_8_)(&uStack_e0,&uStack_e0,3);
  }
  ThreadPool::AddToJobList
            ((ThreadPool *)auStack_c0,
             (ParallelJob *)
             threadPool._M_t.super___uniq_ptr_impl<ThreadPool,_std::default_delete<ThreadPool>_>.
             _M_t.super__Tuple_impl<0UL,_ThreadPool_*,_std::default_delete<ThreadPool>_>.
             super__Head_base<0UL,_ThreadPool_*,_false>._M_head_impl);
  while( true ) {
    bVar7 = (**(code **)((long)appuStack_b0[0] + 0x18))(appuStack_b0);
    if ((bVar7 | appuStack_b0[3]._0_4_ != 0) != 1) break;
    ThreadPool::WorkOrWait
              ((ThreadPool *)
               threadPool._M_t.super___uniq_ptr_impl<ThreadPool,_std::default_delete<ThreadPool>_>.
               _M_t.super__Tuple_impl<0UL,_ThreadPool_*,_std::default_delete<ThreadPool>_>.
               super__Head_base<0UL,_ThreadPool_*,_false>._M_head_impl,
               (unique_lock<std::mutex> *)auStack_c0);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)auStack_c0);
  appuStack_b0[0] = &PTR__ParallelForLoop1D_00109cc0;
  if (pcStack_80 != (code *)0x0) {
    (*pcStack_80)(&uStack_90,&uStack_90,3);
  }
  return;
}

Assistant:

void ParallelForLoop1D::RunStep(std::unique_lock<std::mutex> *lock) {
    // Find the set of loop iterations to run next
    int64_t indexStart = nextIndex;
    int64_t indexEnd = std::min(indexStart + chunkSize, maxIndex);

    // Update _loop_ to reflect iterations this thread will run
    nextIndex = indexEnd;

    if (!HaveWork())
        threadPool->RemoveFromJobList(this);

    lock->unlock();

    // Run loop indices in _[indexStart, indexEnd)_
    func(indexStart, indexEnd);
}